

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::select_variables(solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                   *this,int r_size,int bkmin,int bkmax)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int unaff_R12D;
  long lVar6;
  double dVar7;
  
  iVar5 = bkmin;
  if (r_size < bkmin) {
    iVar5 = r_size;
  }
  if (bkmin == bkmax) {
    iVar5 = iVar5 + -1;
  }
  else {
    iVar3 = bkmax;
    if (r_size < bkmax) {
      iVar3 = r_size;
    }
    bVar1 = bkmax < iVar5;
    if (iVar5 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
      unaff_R12D = r_size + -1;
      lVar4 = (long)r_size << 4;
      lVar6 = (long)r_size;
      do {
        dVar7 = *(double *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar4);
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          bVar2 = dVar7 < 0.0;
        }
        else {
          dVar7 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar2 = dVar7 < 0.5;
        }
        if (bVar2) break;
        bVar1 = iVar3 <= lVar6;
        unaff_R12D = unaff_R12D + 1;
        lVar4 = lVar4 + 0x10;
        lVar6 = lVar6 + 1;
      } while (iVar5 != unaff_R12D);
    }
    iVar5 = iVar3 + -1;
    if (!bVar1) {
      iVar5 = unaff_R12D;
    }
  }
  return iVar5;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }